

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O3

void __thiscall rsg::VariableScope::~VariableScope(VariableScope *this)

{
  Variable *pVVar1;
  pointer ppVVar2;
  
  ppVVar2 = (this->m_declaredVariables).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 !=
      (this->m_declaredVariables).
      super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      pVVar1 = *ppVVar2;
      if (pVVar1 != (Variable *)0x0) {
        Variable::~Variable(pVVar1);
      }
      operator_delete(pVVar1,0x80);
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 !=
             (this->m_declaredVariables).
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  ppVVar2 = (this->m_liveVariables).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 !=
      (this->m_liveVariables).super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      pVVar1 = *ppVVar2;
      if (pVVar1 != (Variable *)0x0) {
        Variable::~Variable(pVVar1);
      }
      operator_delete(pVVar1,0x80);
      ppVVar2 = ppVVar2 + 1;
    } while (ppVVar2 !=
             (this->m_liveVariables).
             super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppVVar2 = (this->m_liveVariables).
              super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->m_liveVariables).
                                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2
                   );
  }
  ppVVar2 = (this->m_declaredVariables).
            super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar2 != (pointer)0x0) {
    operator_delete(ppVVar2,(long)(this->m_declaredVariables).
                                  super__Vector_base<rsg::Variable_*,_std::allocator<rsg::Variable_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar2
                   );
    return;
  }
  return;
}

Assistant:

VariableScope::~VariableScope (void)
{
	for (vector<Variable*>::iterator i = m_declaredVariables.begin(); i != m_declaredVariables.end(); i++)
		delete *i;

	for (vector<Variable*>::iterator i = m_liveVariables.begin(); i != m_liveVariables.end(); i++)
		delete *i;
}